

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

Abc_Cex_t *
Bmc_CexEssentialBitOne(Gia_Man_t *p,Abc_Cex_t *pCexState,int iBit,Abc_Cex_t *pCexPrev,int *pfEqual)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Abc_Cex_t *p_00;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  bool bVar9;
  uint local_60;
  int iBitShift;
  int fEqual;
  int fChanges;
  int fCompl1;
  int fCompl0;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pNew;
  int *pfEqual_local;
  Abc_Cex_t *pCexPrev_local;
  int iBit_local;
  Abc_Cex_t *pCexState_local;
  Gia_Man_t *p_local;
  
  if (pCexState->nRegs != 0) {
    __assert_fail("pCexState->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x289,
                  "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                 );
  }
  if (iBit < pCexState->nBits) {
    if (pfEqual != (int *)0x0) {
      *pfEqual = 0;
    }
    iVar3 = Gia_ManCiNum(p);
    p_00 = Abc_CexAllocFull(0,iVar3,pCexState->iFrame + 1);
    p_00->iFrame = pCexState->iFrame;
    p_00->iPo = pCexState->iPo;
    Abc_InfoXorBit((uint *)(p_00 + 1),iBit);
    pGVar7 = Gia_ManConst0(p);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
    pGVar7 = Gia_ManConst0(p);
    *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xbfffffffffffffff | 0x4000000000000000;
    fCompl0 = iBit / pCexState->nPis;
    do {
      if (pCexState->iFrame < fCompl0) {
        return p_00;
      }
      fCompl1 = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p->vCis);
        bVar8 = false;
        if (fCompl1 < iVar3) {
          _k = Gia_ManCi(p,fCompl1);
          bVar8 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        uVar6 = Abc_InfoHasBit((uint *)(pCexState + 1),fCompl0 * pCexState->nPis + fCompl1);
        *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)uVar6 & 1) << 0x1e;
        uVar6 = Abc_InfoHasBit((uint *)(p_00 + 1),fCompl0 * pCexState->nPis + fCompl1);
        *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff | ((ulong)uVar6 & 1) << 0x3e;
        fCompl1 = fCompl1 + 1;
      }
      fCompl1 = 0;
      while( true ) {
        bVar8 = false;
        if (fCompl1 < p->nObjs) {
          _k = Gia_ManObj(p,fCompl1);
          bVar8 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        iVar3 = Gia_ObjIsAnd(_k);
        if (iVar3 != 0) {
          pGVar7 = Gia_ObjFanin0(_k);
          uVar2 = *(ulong *)pGVar7;
          uVar6 = Gia_ObjFaninC0(_k);
          uVar6 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar6;
          pGVar7 = Gia_ObjFanin1(_k);
          uVar2 = *(ulong *)pGVar7;
          uVar4 = Gia_ObjFaninC1(_k);
          uVar4 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar4;
          *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff | ((ulong)(uVar6 & uVar4) & 1) << 0x1e;
          if ((*(ulong *)_k >> 0x1e & 1) == 0) {
            if ((uVar6 == 0) && (uVar4 == 0)) {
              pGVar7 = Gia_ObjFanin0(_k);
              uVar1 = *(undefined8 *)pGVar7;
              pGVar7 = Gia_ObjFanin1(_k);
              *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                             (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 |
                                    (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
            }
            else if (uVar6 == 0) {
              pGVar7 = Gia_ObjFanin0(_k);
              *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                             (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
            }
            else {
              if (uVar4 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                              ,0x2aa,
                              "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
                             );
              }
              pGVar7 = Gia_ObjFanin1(_k);
              *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                             (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
            }
          }
          else {
            pGVar7 = Gia_ObjFanin0(_k);
            uVar1 = *(undefined8 *)pGVar7;
            pGVar7 = Gia_ObjFanin1(_k);
            *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                           (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 &
                                  (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
          }
        }
        fCompl1 = fCompl1 + 1;
      }
      fCompl1 = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p->vCos);
        bVar8 = false;
        if (fCompl1 < iVar3) {
          _k = Gia_ManCo(p,fCompl1);
          bVar8 = _k != (Gia_Obj_t *)0x0;
        }
        if (!bVar8) break;
        pGVar7 = Gia_ObjFanin0(_k);
        uVar2 = *(ulong *)pGVar7;
        uVar6 = Gia_ObjFaninC0(_k);
        *(ulong *)_k = *(ulong *)_k & 0xffffffffbfffffff |
                       ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar6) & 1) << 0x1e;
        pGVar7 = Gia_ObjFanin0(_k);
        *(ulong *)_k = *(ulong *)_k & 0xbfffffffffffffff |
                       (ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x3e) & 1) << 0x3e;
        fCompl1 = fCompl1 + 1;
      }
      if (fCompl0 < pCexState->iFrame) {
        bVar8 = false;
        local_60 = (uint)(pCexPrev != (Abc_Cex_t *)0x0);
        iVar3 = pCexState->nPis;
        iVar5 = Gia_ManPiNum(p);
        iVar5 = (fCompl0 + 1) * iVar3 + iVar5;
        fCompl1 = 0;
        while( true ) {
          iVar3 = Gia_ManRegNum(p);
          bVar9 = false;
          if (fCompl1 < iVar3) {
            iVar3 = Gia_ManPoNum(p);
            _k = Gia_ManCo(p,iVar3 + fCompl1);
            bVar9 = _k != (Gia_Obj_t *)0x0;
          }
          if (!bVar9) break;
          if (((local_60 != 0) && (pCexPrev != (Abc_Cex_t *)0x0)) &&
             (uVar2 = *(ulong *)_k, uVar6 = Abc_InfoHasBit((uint *)(pCexPrev + 1),iVar5 + fCompl1),
             ((uint)(uVar2 >> 0x3e) & 1) != uVar6)) {
            local_60 = 0;
          }
          if ((*(ulong *)_k >> 0x3e & 1) == 0) {
            bVar8 = true;
            Abc_InfoXorBit((uint *)(p_00 + 1),iVar5 + fCompl1);
          }
          fCompl1 = fCompl1 + 1;
        }
        if ((!bVar8) || (local_60 != 0)) {
          if (pfEqual != (int *)0x0) {
            *pfEqual = local_60;
          }
          Abc_CexFree(p_00);
          return (Abc_Cex_t *)0x0;
        }
      }
      fCompl0 = fCompl0 + 1;
    } while( true );
  }
  __assert_fail("iBit < pCexState->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                ,0x28a,
                "Abc_Cex_t *Bmc_CexEssentialBitOne(Gia_Man_t *, Abc_Cex_t *, int, Abc_Cex_t *, int *)"
               );
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBitOne( Gia_Man_t * p, Abc_Cex_t * pCexState, int iBit, Abc_Cex_t * pCexPrev, int * pfEqual )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k, fCompl0, fCompl1;
    assert( pCexState->nRegs == 0 );
    assert( iBit < pCexState->nBits );
    if ( pfEqual )
        *pfEqual = 0;
    // start the counter-example
    pNew = Abc_CexAllocFull( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // clean bit
    Abc_InfoXorBit( pNew->pData, iBit );
    // simulate the remaining frames
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    for ( i = iBit / pCexState->nPis; i <= pCexState->iFrame; i++ )
    {
        Gia_ManForEachCi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCexState->pData, i * pCexState->nPis + k );
            pObj->fMark1 = Abc_InfoHasBit( pNew->pData,      i * pCexState->nPis + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }
        if ( i < pCexState->iFrame )
        {
            int fChanges  = 0;
            int fEqual    = (pCexPrev != NULL);
            int iBitShift = (i + 1) * pCexState->nPis + Gia_ManPiNum(p);
            Gia_ManForEachRi( p, pObj, k )
            {
                if ( fEqual && pCexPrev && (int)pObj->fMark1 != Abc_InfoHasBit(pCexPrev->pData, iBitShift + k) )
                    fEqual = 0;
                if ( !pObj->fMark1 )
                {
                    fChanges = 1;
                    Abc_InfoXorBit( pNew->pData, iBitShift + k );
                }
            }
            if ( !fChanges || fEqual )
            {
                if ( pfEqual )
                    *pfEqual = fEqual;
                Abc_CexFree( pNew );
                return NULL;
            }
        }
/*
        if ( i == 20 )
        {
            printf( "Frame %d : ", i );
            Gia_ManForEachRi( p, pObj, k )
                printf( "%d", pObj->fMark1 );
            printf( "\n" );
        }
*/
    }
    return pNew;
}